

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaCheckElementDeclComponent(xmlSchemaElementPtr elemDecl,xmlSchemaParserCtxtPtr ctxt)

{
  xmlSchemaTypePtr pxVar1;
  xmlSchemaTypePtr pxVar2;
  undefined8 *puVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  xmlSchemaParserCtxtPtr pxVar13;
  xmlChar *pxVar14;
  xmlChar *pxVar15;
  xmlChar *str3;
  xmlSchemaParserCtxtPtr pxVar16;
  long *payload;
  xmlHashTablePtr pxVar17;
  xmlSchemaItemListPtr pxVar18;
  xmlSchemaElementPtr head;
  _xmlSchemaElement *p_Var19;
  xmlSchemaParserCtxtPtr pxVar20;
  char *name;
  xmlSchemaTypePtr pxVar21;
  char *in_R8;
  xmlSchemaTypePtr pxVar22;
  xmlChar *strB;
  xmlChar *strA;
  xmlChar *local_58;
  xmlChar *local_50;
  xmlSchemaParserCtxtPtr local_48;
  xmlChar *local_40;
  xmlSchemaParserCtxtPtr local_38;
  
  if (elemDecl == (xmlSchemaElementPtr)0x0) {
    return;
  }
  if (((uint)elemDecl->flags >> 0x12 & 1) != 0) {
    return;
  }
  elemDecl->flags = elemDecl->flags | 0x40000;
  pxVar13 = (xmlSchemaParserCtxtPtr)elemDecl->subtypes;
  pxVar16 = (xmlSchemaParserCtxtPtr)elemDecl->refDecl;
  pxVar20 = ctxt;
  if (pxVar16 == (xmlSchemaParserCtxtPtr)0x0) {
    iVar12 = 0;
  }
  else {
    local_48 = pxVar13;
    xmlSchemaCheckElementDeclComponent((xmlSchemaElementPtr)pxVar16,ctxt);
    iVar12 = 0;
    if ((elemDecl->flags & 2) == 0) {
      in_R8 = "Only global element declarations can have a substitution group affiliation";
      iVar12 = 0xbe6;
      pxVar20 = (xmlSchemaParserCtxtPtr)0xbe6;
      xmlSchemaPCustomErrExt
                (ctxt,XML_SCHEMAP_E_PROPS_CORRECT_3,(xmlSchemaBasicItemPtr)elemDecl,(xmlNodePtr)0x0,
                 "Only global element declarations can have a substitution group affiliation",
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    }
    pxVar13 = pxVar16;
    if (pxVar16 != (xmlSchemaParserCtxtPtr)elemDecl) {
      if ((_xmlSchemaElement *)pxVar16->dict == (_xmlSchemaElement *)0x0) {
        pxVar13 = (xmlSchemaParserCtxtPtr)0x0;
      }
      else {
        pxVar20 = pxVar16;
        pxVar13 = (xmlSchemaParserCtxtPtr)
                  xmlSchemaCheckSubstGroupCircular
                            ((xmlSchemaElementPtr)pxVar16,(xmlSchemaElementPtr)pxVar16);
      }
    }
    if (pxVar13 != (xmlSchemaParserCtxtPtr)0x0) {
      local_50 = (xmlChar *)0x0;
      local_58 = (xmlChar *)0x0;
      local_38 = ctxt;
      pxVar14 = xmlSchemaGetComponentQName(&local_50,pxVar13);
      pxVar15 = xmlSchemaGetComponentQName(&local_58,pxVar16);
      ctxt = local_38;
      in_R8 = 
      "The element declaration \'%s\' defines a circular substitution group to element declaration \'%s\'"
      ;
      pxVar20 = (xmlSchemaParserCtxtPtr)0xbe9;
      xmlSchemaPCustomErrExt
                (local_38,XML_SCHEMAP_E_PROPS_CORRECT_6,(xmlSchemaBasicItemPtr)pxVar13,
                 (xmlNodePtr)0x0,
                 "The element declaration \'%s\' defines a circular substitution group to element declaration \'%s\'"
                 ,pxVar14,pxVar15,(xmlChar *)0x0);
      if (local_50 != (xmlChar *)0x0) {
        (*xmlFree)(local_50);
        local_50 = (xmlChar *)0x0;
      }
      if (local_58 != (xmlChar *)0x0) {
        (*xmlFree)(local_58);
        local_58 = (xmlChar *)0x0;
      }
      iVar12 = 0xbe9;
    }
    pxVar13 = local_48;
    if ((local_48 != (xmlSchemaParserCtxtPtr)elemDecl->refDecl->subtypes) &&
       (pxVar20 = local_48,
       iVar8 = xmlSchemaCheckCOSDerivedOK
                         ((xmlSchemaAbstractCtxtPtr)ctxt,(xmlSchemaTypePtr)local_48,
                          *(xmlSchemaTypePtr *)&pxVar16->ownsConstructor,
                          *(uint *)&pxVar16->doc >> 0x10 & 1 | *(uint *)&pxVar16->doc >> 0xe & 2),
       iVar8 != 0)) {
      local_50 = (xmlChar *)0x0;
      local_58 = (xmlChar *)0x0;
      local_40 = (xmlChar *)0x0;
      pxVar14 = xmlSchemaGetComponentQName(&local_50,pxVar13);
      pxVar15 = xmlSchemaGetComponentQName(&local_58,pxVar16);
      str3 = xmlSchemaGetComponentQName(&local_40,*(xmlSchemaTypePtr *)&pxVar16->ownsConstructor);
      in_R8 = 
      "The type definition \'%s\' was either rejected by the substitution group affiliation \'%s\', or not validly derived from its type definition \'%s\'"
      ;
      pxVar20 = (xmlSchemaParserCtxtPtr)0xbe7;
      xmlSchemaPCustomErrExt
                (ctxt,XML_SCHEMAP_E_PROPS_CORRECT_4,(xmlSchemaBasicItemPtr)elemDecl,(xmlNodePtr)0x0,
                 "The type definition \'%s\' was either rejected by the substitution group affiliation \'%s\', or not validly derived from its type definition \'%s\'"
                 ,pxVar14,pxVar15,str3);
      if (local_50 != (xmlChar *)0x0) {
        (*xmlFree)(local_50);
        local_50 = (xmlChar *)0x0;
      }
      if (local_58 != (xmlChar *)0x0) {
        (*xmlFree)(local_58);
        local_58 = (xmlChar *)0x0;
      }
      pxVar13 = local_48;
      if (local_40 != (xmlChar *)0x0) {
        (*xmlFree)(local_40);
        local_40 = (xmlChar *)0x0;
      }
      iVar12 = 0xbe7;
    }
  }
  iVar8 = (int)pxVar20;
  pxVar14 = elemDecl->value;
  if (pxVar14 == (xmlChar *)0x0) goto LAB_0019fdda;
  iVar10 = pxVar13->type;
  if (iVar10 == 5) {
LAB_0019fc2c:
    if (((*(uint *)((long)&pxVar13->doc + 4) | 2) == 6) &&
       (iVar8 = xmlSchemaIsDerivedFromBuiltInType(*(xmlSchemaTypePtr *)&pxVar13->xsiAssemble,iVar8),
       iVar8 != 0)) {
LAB_0019fc48:
      in_R8 = 
      "The type definition (or type definition\'s content type) is or is derived from ID; value constraints are not allowed in conjunction with such a type definition"
      ;
      iVar12 = 0xbe8;
      xmlSchemaPCustomErrExt
                (ctxt,XML_SCHEMAP_E_PROPS_CORRECT_5,(xmlSchemaBasicItemPtr)elemDecl,(xmlNodePtr)0x0,
                 "The type definition (or type definition\'s content type) is or is derived from ID; value constraints are not allowed in conjunction with such a type definition"
                 ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      goto LAB_0019fdda;
    }
  }
  else {
    if (iVar10 == 4) {
LAB_0019fc11:
      iVar9 = xmlSchemaIsDerivedFromBuiltInType((xmlSchemaTypePtr)pxVar13,iVar8);
      if (iVar9 == 0) {
LAB_0019fc1d:
        if (iVar10 == 5) goto LAB_0019fc2c;
        goto LAB_0019fc22;
      }
      goto LAB_0019fc48;
    }
    if (iVar10 == 1) {
      if (*(int *)&pxVar13->ctxtType != 0x2d) goto LAB_0019fc11;
      goto LAB_0019fc1d;
    }
LAB_0019fc22:
    if (*(int *)&pxVar13->ctxtType == 0x2d) goto LAB_0019fc2c;
  }
  if (pxVar14 == (xmlChar *)0x0) goto LAB_0019fdda;
  if (elemDecl->node == (xmlNode *)0x0) {
    pxVar16 = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    name = "fixed";
    if ((elemDecl->flags & 8) == 0) {
      name = "default";
    }
    pxVar16 = (xmlSchemaParserCtxtPtr)xmlHasProp(elemDecl->node,(xmlChar *)name);
  }
  pxVar14 = elemDecl->value;
  iVar8 = pxVar13->type;
  if (((((iVar8 == 5) || (*(int *)&pxVar13->ctxtType == 0x2d)) &&
       (iVar10 = *(int *)((long)&pxVar13->doc + 4), iVar10 != 6)) && (iVar10 != 4)) &&
     ((iVar10 != 3 ||
      (local_48 = pxVar16,
      iVar10 = xmlSchemaIsParticleEmptiable(*(xmlSchemaParticlePtr *)&pxVar13->ownsConstructor),
      pxVar16 = local_48, iVar10 == 0)))) {
    in_R8 = 
    "For a string to be a valid default, the type definition must be a simple type or a complex type with mixed content and a particle emptiable"
    ;
    iVar8 = 0xbf3;
    xmlSchemaPCustomErrExt
              (ctxt,XML_SCHEMAP_COS_VALID_DEFAULT_2_1,(xmlSchemaBasicItemPtr)pxVar13,
               *(xmlNodePtr *)&pxVar13->counter,
               "For a string to be a valid default, the type definition must be a simple type or a complex type with mixed content and a particle emptiable"
               ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
  }
  else {
    in_R8 = (char *)&elemDecl->defVal;
    if ((iVar8 != 4) && ((iVar8 != 1 || (*(int *)&pxVar13->ctxtType == 0x2d)))) {
      if ((*(uint *)((long)&pxVar13->doc + 4) | 2) != 6) {
        iVar8 = 0;
        goto LAB_0019fdb4;
      }
      pxVar13 = *(xmlSchemaParserCtxtPtr *)&pxVar13->xsiAssemble;
    }
    iVar8 = xmlSchemaVCheckCVCSimpleType
                      ((xmlSchemaAbstractCtxtPtr)ctxt,(xmlNodePtr)pxVar16,(xmlSchemaTypePtr)pxVar13,
                       pxVar14,(xmlSchemaValPtr *)in_R8,1,1,0);
    if (iVar8 < 0) {
      xmlSchemaInternalErr2
                ((xmlSchemaAbstractCtxtPtr)ctxt,"xmlSchemaParseCheckCOSValidDefault",
                 "calling xmlSchemaVCheckCVCSimpleType()",(xmlChar *)0x0,(xmlChar *)in_R8);
    }
  }
LAB_0019fdb4:
  if ((iVar8 != 0) && (iVar12 = 0xbe8, iVar8 < 0)) {
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)ctxt,"xmlSchemaElemCheckValConstr",
               "failed to validate the value constraint of an element declaration",(xmlChar *)0x0,
               (xmlChar *)in_R8);
  }
LAB_0019fdda:
  if (((iVar12 == 0) && (p_Var19 = elemDecl->refDecl, p_Var19 != (_xmlSchemaElement *)0x0)) &&
     ((elemDecl->flags & 0x10) == 0)) {
    do {
      if (((uint)p_Var19->flags >> 0xd & 1) == 0) {
        pxVar1 = p_Var19->subtypes;
        pxVar21 = elemDecl->subtypes;
        if (pxVar1 != pxVar21) {
          bVar5 = false;
          bVar6 = false;
          pxVar22 = pxVar21;
          if (pxVar21 != (xmlSchemaTypePtr)0x0) {
            while (pxVar2 = pxVar22->baseType, in_R8 = (char *)pxVar22, pxVar22 != pxVar2) {
              uVar11 = pxVar22->flags;
              bVar7 = true;
              if (bVar6) {
                bVar7 = bVar5;
              }
              if ((uVar11 & 2) == 0) {
                bVar7 = bVar5;
              }
              bVar5 = bVar7;
              bVar7 = true;
              if (bVar6) {
                bVar7 = bVar6;
              }
              if ((uVar11 & 4) == 0) {
                bVar7 = bVar6;
              }
              bVar6 = bVar7;
              in_R8 = (char *)(ulong)uVar11;
              if ((pxVar2 == (xmlSchemaTypePtr)0x0) ||
                 (in_R8 = (char *)pxVar2, pxVar22 = pxVar2, pxVar2 == pxVar1)) break;
            }
          }
          uVar11 = (p_Var19->flags & 0x1800U) << 7;
          do {
            pxVar21 = pxVar21->baseType;
            if ((pxVar21 == (xmlSchemaTypePtr)0x0) ||
               ((pxVar21->type != 5 && (pxVar21->builtInType != 0x2d)))) break;
            uVar4 = uVar11 | 0x40000;
            if ((uVar11 >> 0x12 & 1) != 0) {
              uVar4 = uVar11;
            }
            if ((pxVar21->flags & 0x40000U) == 0) {
              uVar4 = uVar11;
            }
            in_R8 = (char *)(ulong)uVar4;
            uVar11 = uVar4 | 0x80000;
            if (uVar4 >> 0x13 != 0) {
              uVar11 = uVar4;
            }
            if ((pxVar21->flags & 0x80000U) == 0) {
              uVar11 = uVar4;
            }
          } while (pxVar21 != pxVar1);
          if ((uVar11 != 0) &&
             ((((uVar11 >> 0x12 & 1) != 0 && (bVar5)) || ((uVar11 >> 0x13 != 0 && (bVar6))))))
          goto LAB_001a005f;
        }
        pxVar17 = ctxt->constructor->substGroups;
        if (pxVar17 == (xmlHashTablePtr)0x0) {
          payload = (long *)0x0;
        }
        else {
          payload = (long *)xmlHashLookup2(pxVar17,p_Var19->name,p_Var19->targetNamespace);
        }
        if (payload == (long *)0x0) {
          if (ctxt->constructor->substGroups == (xmlHashTablePtr)0x0) {
            pxVar17 = xmlHashCreateDict(10,ctxt->dict);
            ctxt->constructor->substGroups = pxVar17;
            if (pxVar17 != (xmlHashTablePtr)0x0) goto LAB_0019ff61;
          }
          else {
LAB_0019ff61:
            payload = (long *)(*xmlMalloc)(0x10);
            if (payload == (long *)0x0) {
              in_R8 = (char *)0x0;
              xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                                  0x10,(xmlError *)0x0);
            }
            else {
              *payload = 0;
              payload[1] = 0;
              *payload = (long)p_Var19;
              pxVar18 = xmlSchemaItemListCreate();
              payload[1] = (long)pxVar18;
              if (pxVar18 != (xmlSchemaItemListPtr)0x0) {
                iVar12 = xmlHashAddEntry2(ctxt->constructor->substGroups,p_Var19->name,
                                          p_Var19->targetNamespace,payload);
                if (iVar12 != 0) {
                  xmlSchemaInternalErr2
                            ((xmlSchemaAbstractCtxtPtr)ctxt,"xmlSchemaSubstGroupAdd",
                             "failed to add a new substitution container",(xmlChar *)0x0,
                             (xmlChar *)in_R8);
                  puVar3 = (undefined8 *)payload[1];
                  if (puVar3 != (undefined8 *)0x0) {
                    if ((void *)*puVar3 != (void *)0x0) {
                      (*xmlFree)((void *)*puVar3);
                    }
                    (*xmlFree)(puVar3);
                  }
                  (*xmlFree)(payload);
                  payload = (long *)0x0;
                }
                goto LAB_001a0038;
              }
              (*xmlFree)(payload);
            }
          }
          payload = (long *)0x0;
        }
LAB_001a0038:
        if (payload != (long *)0x0) {
          xmlSchemaItemListAddSize((xmlSchemaItemListPtr)payload[1],0x14,elemDecl);
        }
        if (((uint)p_Var19->flags >> 0x11 & 1) == 0) {
          p_Var19->flags = p_Var19->flags | 0x20000;
        }
      }
LAB_001a005f:
      p_Var19 = p_Var19->refDecl;
    } while (p_Var19 != (_xmlSchemaElement *)0x0);
  }
  return;
}

Assistant:

static void
xmlSchemaCheckElementDeclComponent(xmlSchemaElementPtr elemDecl,
				   xmlSchemaParserCtxtPtr ctxt)
{
    if (elemDecl == NULL)
	return;
    if (elemDecl->flags & XML_SCHEMAS_ELEM_INTERNAL_CHECKED)
	return;
    elemDecl->flags |= XML_SCHEMAS_ELEM_INTERNAL_CHECKED;
    if (xmlSchemaCheckElemPropsCorrect(ctxt, elemDecl) == 0) {
	/*
	* Adds substitution group members.
	*/
	xmlSchemaCheckElemSubstGroup(ctxt, elemDecl);
    }
}